

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::swizzlePixels<unsigned_int>
               (PixelBufferAccess *dst,ConstPixelBufferAccess *src,MaybeTextureSwizzle *swizzle)

{
  int iVar1;
  ConstPixelBufferAccess *this;
  int iVar2;
  undefined1 local_4c [16];
  UVec4 local_3c;
  int local_2c;
  int local_28;
  int x;
  int y;
  int z;
  MaybeTextureSwizzle *swizzle_local;
  ConstPixelBufferAccess *src_local;
  PixelBufferAccess *dst_local;
  
  x = 0;
  _y = swizzle;
  swizzle_local = (MaybeTextureSwizzle *)src;
  src_local = &dst->super_ConstPixelBufferAccess;
  while( true ) {
    iVar1 = x;
    iVar2 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)swizzle_local);
    if (iVar2 <= iVar1) break;
    local_28 = 0;
    while( true ) {
      iVar1 = local_28;
      iVar2 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)swizzle_local);
      if (iVar2 <= iVar1) break;
      local_2c = 0;
      while( true ) {
        iVar1 = local_2c;
        iVar2 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)swizzle_local);
        this = src_local;
        if (iVar2 <= iVar1) break;
        tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                  ((ConstPixelBufferAccess *)local_4c,(int)swizzle_local,local_2c,local_28);
        swizzleColor<unsigned_int>
                  ((anon_unknown_0 *)&local_3c,(Vector<unsigned_int,_4> *)local_4c,_y);
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)this,&local_3c,local_2c,local_28,x);
        local_2c = local_2c + 1;
      }
      local_28 = local_28 + 1;
    }
    x = x + 1;
  }
  return;
}

Assistant:

static void swizzlePixels (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, const MaybeTextureSwizzle& swizzle)
{
	DE_ASSERT(dst.getWidth()  == src.getWidth()  &&
			  dst.getHeight() == src.getHeight() &&
			  dst.getDepth()  == src.getDepth());
	for (int z = 0; z < src.getDepth(); z++)
	for (int y = 0; y < src.getHeight(); y++)
	for (int x = 0; x < src.getWidth(); x++)
		dst.setPixel(swizzleColor(src.getPixelT<T>(x, y, z), swizzle), x, y, z);
}